

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::TransformEnd(ParsedScene *this,FileLoc loc)

{
  pointer *pppVar1;
  pointer pTVar2;
  pointer puVar3;
  pointer ppVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  char *fmt;
  char vb;
  string ret;
  
  if (this->currentApiState == OptionsBlock) {
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[13]>
              (&ret,"Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [13])0x2ea374f);
    Error(&loc,ret._M_dataplus._M_p);
LAB_0052b209:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != &ret.field_2) {
      operator_delete(ret._M_dataplus._M_p,
                      CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0])
                      + 1);
    }
    return;
  }
  if (this->currentApiState == Uninitialized) {
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[13]>
              (&ret,"pbrtInit() must be before calling \"%s()\". Ignoring.",(char (*) [13])0x2ea374f
              );
    Error(&loc,ret._M_dataplus._M_p);
    goto LAB_0052b209;
  }
  pTVar2 = (this->pushedTransforms).
           super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->pushedTransforms).
      super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
      super__Vector_impl_data._M_start == pTVar2) {
    Error(&loc,"Unmatched TransformEnd encountered. Ignoring it.");
    return;
  }
  uVar5 = *(undefined8 *)pTVar2[-1].t[0].m.m[0];
  uVar6 = *(undefined8 *)(pTVar2[-1].t[0].m.m[0] + 2);
  uVar7 = *(undefined8 *)pTVar2[-1].t[0].m.m[1];
  uVar8 = *(undefined8 *)(pTVar2[-1].t[0].m.m[1] + 2);
  uVar9 = *(undefined8 *)pTVar2[-1].t[0].m.m[2];
  uVar10 = *(undefined8 *)(pTVar2[-1].t[0].m.m[2] + 2);
  uVar11 = *(undefined8 *)pTVar2[-1].t[0].m.m[3];
  uVar12 = *(undefined8 *)(pTVar2[-1].t[0].m.m[3] + 2);
  uVar13 = *(undefined8 *)pTVar2[-1].t[0].mInv.m[0];
  uVar14 = *(undefined8 *)(pTVar2[-1].t[0].mInv.m[0] + 2);
  uVar15 = *(undefined8 *)pTVar2[-1].t[0].mInv.m[1];
  uVar16 = *(undefined8 *)(pTVar2[-1].t[0].mInv.m[1] + 2);
  uVar17 = *(undefined8 *)pTVar2[-1].t[0].mInv.m[2];
  uVar18 = *(undefined8 *)(pTVar2[-1].t[0].mInv.m[2] + 2);
  uVar19 = *(undefined8 *)pTVar2[-1].t[0].mInv.m[3];
  uVar20 = *(undefined8 *)(pTVar2[-1].t[0].mInv.m[3] + 2);
  uVar21 = *(undefined8 *)pTVar2[-1].t[1].m.m[0];
  uVar22 = *(undefined8 *)(pTVar2[-1].t[1].m.m[0] + 2);
  uVar23 = *(undefined8 *)pTVar2[-1].t[1].m.m[1];
  uVar24 = *(undefined8 *)(pTVar2[-1].t[1].m.m[1] + 2);
  uVar25 = *(undefined8 *)pTVar2[-1].t[1].m.m[2];
  uVar26 = *(undefined8 *)(pTVar2[-1].t[1].m.m[2] + 2);
  uVar27 = *(undefined8 *)pTVar2[-1].t[1].m.m[3];
  uVar28 = *(undefined8 *)(pTVar2[-1].t[1].m.m[3] + 2);
  uVar29 = *(undefined8 *)(pTVar2[-1].t[1].mInv.m[0] + 2);
  uVar30 = *(undefined8 *)pTVar2[-1].t[1].mInv.m[1];
  uVar31 = *(undefined8 *)(pTVar2[-1].t[1].mInv.m[1] + 2);
  uVar32 = *(undefined8 *)pTVar2[-1].t[1].mInv.m[2];
  uVar33 = *(undefined8 *)(pTVar2[-1].t[1].mInv.m[2] + 2);
  uVar34 = *(undefined8 *)pTVar2[-1].t[1].mInv.m[3];
  uVar35 = *(undefined8 *)(pTVar2[-1].t[1].mInv.m[3] + 2);
  *(undefined8 *)(this->curTransform).t[1].mInv.m[0] = *(undefined8 *)pTVar2[-1].t[1].mInv.m[0];
  *(undefined8 *)((this->curTransform).t[1].mInv.m[0] + 2) = uVar29;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[1] = uVar30;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[1] + 2) = uVar31;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[2] = uVar32;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[2] + 2) = uVar33;
  *(undefined8 *)(this->curTransform).t[1].mInv.m[3] = uVar34;
  *(undefined8 *)((this->curTransform).t[1].mInv.m[3] + 2) = uVar35;
  *(undefined8 *)(this->curTransform).t[1].m.m[0] = uVar21;
  *(undefined8 *)((this->curTransform).t[1].m.m[0] + 2) = uVar22;
  *(undefined8 *)(this->curTransform).t[1].m.m[1] = uVar23;
  *(undefined8 *)((this->curTransform).t[1].m.m[1] + 2) = uVar24;
  *(undefined8 *)(this->curTransform).t[1].m.m[2] = uVar25;
  *(undefined8 *)((this->curTransform).t[1].m.m[2] + 2) = uVar26;
  *(undefined8 *)(this->curTransform).t[1].m.m[3] = uVar27;
  *(undefined8 *)((this->curTransform).t[1].m.m[3] + 2) = uVar28;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[0] = uVar13;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[0] + 2) = uVar14;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[1] = uVar15;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[1] + 2) = uVar16;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[2] = uVar17;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[2] + 2) = uVar18;
  *(undefined8 *)(this->curTransform).t[0].mInv.m[3] = uVar19;
  *(undefined8 *)((this->curTransform).t[0].mInv.m[3] + 2) = uVar20;
  *(undefined8 *)(this->curTransform).t[0].m.m[0] = uVar5;
  *(undefined8 *)((this->curTransform).t[0].m.m[0] + 2) = uVar6;
  *(undefined8 *)(this->curTransform).t[0].m.m[1] = uVar7;
  *(undefined8 *)((this->curTransform).t[0].m.m[1] + 2) = uVar8;
  *(undefined8 *)(this->curTransform).t[0].m.m[2] = uVar9;
  *(undefined8 *)((this->curTransform).t[0].m.m[2] + 2) = uVar10;
  *(undefined8 *)(this->curTransform).t[0].m.m[3] = uVar11;
  *(undefined8 *)((this->curTransform).t[0].m.m[3] + 2) = uVar12;
  (this->pushedTransforms).
  super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar2 + -1;
  puVar3 = (this->pushedActiveTransformBits).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar4 = (this->pushStack).
           super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->activeTransformBits = puVar3[-1];
  (this->pushedActiveTransformBits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar3 + -1;
  if (ppVar4[-1].first == 'o') {
    fmt = "Mismatched nesting: open ObjectBegin from %s at TransformEnd";
  }
  else {
    if (ppVar4[-1].first != 'a') {
      ret._M_dataplus._M_p._0_1_ = ppVar4[-1].first;
      vb = 't';
      if (ppVar4[-1].first != 't') {
        LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parsedscene.cpp"
                   ,0x2a2,"Check failed: %s == %s with %s = %s, %s = %s",
                   (char (*) [23])"pushStack.back().first",(char (*) [4])"\'t\'",
                   (char (*) [23])"pushStack.back().first",(char *)&ret,(char (*) [4])"\'t\'",&vb);
      }
      goto LAB_0052b30c;
    }
    fmt = "Mismatched nesting: open AttributeBegin from %s at TransformEnd";
  }
  SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
            (&this->super_SceneRepresentation,&loc,fmt,&ppVar4[-1].second);
LAB_0052b30c:
  pppVar1 = &(this->pushStack).
             super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar1 = *pppVar1 + -1;
  return;
}

Assistant:

void ParsedScene::TransformEnd(FileLoc loc) {
    VERIFY_WORLD("TransformEnd");
    if (pushedTransforms.empty()) {
        Error(&loc, "Unmatched TransformEnd encountered. Ignoring it.");
        return;
    }
    curTransform = pushedTransforms.back();
    pushedTransforms.pop_back();
    activeTransformBits = pushedActiveTransformBits.back();
    pushedActiveTransformBits.pop_back();

    if (pushStack.back().first == 'a')
        ErrorExitDeferred(
            &loc, "Mismatched nesting: open AttributeBegin from %s at TransformEnd",
            pushStack.back().second);
    else if (pushStack.back().first == 'o')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open ObjectBegin from %s at TransformEnd",
                          pushStack.back().second);
    else
        CHECK_EQ(pushStack.back().first, 't');
    pushStack.pop_back();
}